

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O1

SequenceCatalogEntry * duckdb::BindSequence(Binder *binder,string *name)

{
  SequenceCatalogEntry *pSVar1;
  QualifiedName qname;
  QualifiedName local_70;
  
  QualifiedName::Parse(&local_70,name);
  pSVar1 = BindSequence(binder,&local_70.catalog,&local_70.schema,&local_70.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
    operator_delete(local_70.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.schema._M_dataplus._M_p != &local_70.schema.field_2) {
    operator_delete(local_70.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.catalog._M_dataplus._M_p != &local_70.catalog.field_2) {
    operator_delete(local_70.catalog._M_dataplus._M_p);
  }
  return pSVar1;
}

Assistant:

SequenceCatalogEntry &BindSequence(Binder &binder, const string &name) {
	auto qname = QualifiedName::Parse(name);
	return BindSequence(binder, qname.catalog, qname.schema, qname.name);
}